

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_0::VertexAttributeCase::init
          (VertexAttributeCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  VertexAttributeCase *this_local;
  long lVar3;
  
  RenderCase::init(&this->super_RenderCase,ctx);
  if (*(int *)&(this->super_RenderCase).field_0x84 == 0) {
    pRVar2 = gles3::Context::getRenderContext((this->super_RenderCase).super_TestCase.m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0x6c8))(1,&this->m_positionVboID);
    (**(code **)(lVar3 + 0x6c8))(1,&this->m_attribVboID);
    this = (VertexAttributeCase *)(**(code **)(lVar3 + 0x6c8))(1,&this->m_elementVboID);
  }
  return (int)this;
}

Assistant:

void VertexAttributeCase::init (void)
{
	RenderCase::init();

	// init gl resources
	if (m_storage == STORAGE_BUFFER)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.genBuffers(1, &m_positionVboID);
		gl.genBuffers(1, &m_attribVboID);
		gl.genBuffers(1, &m_elementVboID);
	}
}